

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

int sam_hdr_name2ref(SAM_hdr *hdr,char *ref)

{
  khint_t kVar1;
  int local_20;
  khint_t k;
  char *ref_local;
  SAM_hdr *hdr_local;
  
  kVar1 = kh_get_m_s2i(hdr->ref_hash,ref);
  if (kVar1 == hdr->ref_hash->n_buckets) {
    local_20 = -1;
  }
  else {
    local_20 = hdr->ref_hash->vals[kVar1];
  }
  return local_20;
}

Assistant:

int sam_hdr_name2ref(SAM_hdr *hdr, const char *ref) {
    khint_t k = kh_get(m_s2i, hdr->ref_hash, ref);
    return k == kh_end(hdr->ref_hash) ? -1 : kh_val(hdr->ref_hash, k);
}